

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynNamespaceElement * __thiscall ParseContext::PushNamespace(ParseContext *this,SynIdentifier *name)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  SynNamespaceElement **ppSVar4;
  ParseContext *this_00;
  ParseContext *local_40;
  SynNamespaceElement *ns;
  SynNamespaceElement *ns_1;
  SynNamespaceElement *pSStack_28;
  uint i;
  SynNamespaceElement *current;
  SynIdentifier *name_local;
  ParseContext *this_local;
  
  pSStack_28 = this->currentNamespace;
  ns_1._4_4_ = 0;
  current = (SynNamespaceElement *)name;
  name_local = (SynIdentifier *)this;
  while( true ) {
    uVar1 = ns_1._4_4_;
    uVar3 = SmallArray<SynNamespaceElement_*,_32U>::size(&this->namespaceList);
    if (uVar3 <= uVar1) {
      this_00 = (ParseContext *)get<SynNamespaceElement>(this);
      SynNamespaceElement::SynNamespaceElement
                ((SynNamespaceElement *)this_00,pSStack_28,(SynIdentifier *)current);
      local_40 = this_00;
      SmallArray<SynNamespaceElement_*,_32U>::push_back
                (&this->namespaceList,(SynNamespaceElement **)&local_40);
      this->currentNamespace = (SynNamespaceElement *)local_40;
      return (SynNamespaceElement *)local_40;
    }
    ppSVar4 = SmallArray<SynNamespaceElement_*,_32U>::operator[](&this->namespaceList,ns_1._4_4_);
    ns = *ppSVar4;
    if ((ns->parent == pSStack_28) &&
       (bVar2 = InplaceStr::operator==(&ns->name->name,(InplaceStr *)&current[2].fullNameHash),
       bVar2)) break;
    ns_1._4_4_ = ns_1._4_4_ + 1;
  }
  this->currentNamespace = ns;
  return ns;
}

Assistant:

SynNamespaceElement* ParseContext::PushNamespace(SynIdentifier *name)
{
	SynNamespaceElement *current = currentNamespace;

	// Search for existing namespace in the same context
	for(unsigned i = 0; i < namespaceList.size(); i++)
	{
		SynNamespaceElement *ns = namespaceList[i];

		if(ns->parent == current && ns->name->name == name->name)
		{
			currentNamespace = ns;
			return ns;
		}
	}

	// Create new namespace
	SynNamespaceElement *ns = new (get<SynNamespaceElement>()) SynNamespaceElement(current, name);
	namespaceList.push_back(ns);

	currentNamespace = ns;
	return ns;
}